

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O0

Loop * __thiscall spvtools::opt::LoopFissionImpl::SplitLoop(LoopFissionImpl *this)

{
  Loop *this_00;
  IRContext *this_01;
  iterator ip;
  UnderlyingIterator UVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  Function *pFVar5;
  BasicBlock *pBVar6;
  iterator src_begin;
  iterator src_end;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> *pUVar7;
  BasicBlockListTy *pBVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  CFG *pCVar11;
  mapped_type *ppIVar12;
  size_type sVar13;
  reference ppIVar14;
  Instruction *i;
  iterator __end2_2;
  iterator __begin2_2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_2;
  Instruction *local_238;
  mapped_type local_230;
  Instruction *old_inst;
  Instruction *inst_1;
  iterator __end3_1;
  iterator __begin3_1;
  BasicBlock *__range3_1;
  BasicBlock *block_1;
  _Node_iterator_base<unsigned_int,_false> _Stack_1f8;
  uint32_t id_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  BasicBlockListTy *__range2_1;
  Instruction *local_1d8;
  Instruction *local_1d0;
  Instruction *local_1c8;
  Instruction *local_1c0;
  Instruction *inst;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *block;
  _Node_iterator_base<unsigned_int,_false> _Stack_190;
  uint32_t id;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  instructions_to_kill;
  undefined1 local_140 [8];
  iterator it;
  Loop *cloned_loop;
  LoopCloningResult clone_results;
  LoopUtils util;
  LoopFissionImpl *this_local;
  
  LoopUtils::LoopUtils
            ((LoopUtils *)
             &clone_results.cloned_bb_.
              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->context_,this->loop_);
  LoopUtils::LoopCloningResult::LoopCloningResult((LoopCloningResult *)&cloned_loop);
  it.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       LoopUtils::CloneAndAttachLoopToHeader
                 ((LoopUtils *)
                  &clone_results.cloned_bb_.
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (LoopCloningResult *)&cloned_loop);
  Loop::UpdateLoopMergeInst((Loop *)it.iterator_._M_current);
  pFVar5 = LoopUtils::GetFunction
                     ((LoopUtils *)
                      &clone_results.cloned_bb_.
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pBVar6 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
  uVar3 = BasicBlock::id(pBVar6);
  _local_140 = Function::FindBlock(pFVar5,uVar3);
  pFVar5 = LoopUtils::GetFunction
                     ((LoopUtils *)
                      &clone_results.cloned_bb_.
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  src_begin = std::
              vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              ::begin((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       *)&clone_results.new_to_old_bb_._M_h._M_single_bucket);
  src_end = std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::end((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   *)&clone_results.new_to_old_bb_._M_h._M_single_bucket);
  pUVar7 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_140);
  instructions_to_kill.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pUVar7->container_;
  ip.container_ = pUVar7->container_;
  ip.iterator_._M_current = (pUVar7->iterator_)._M_current;
  Function::
  AddBasicBlocks<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>>
            (pFVar5,(__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                     )src_begin._M_current,
             (__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
              )src_end._M_current,ip);
  this_00 = this->loop_;
  pBVar6 = Loop::GetMergeBlock((Loop *)it.iterator_._M_current);
  Loop::SetPreHeaderBlock(this_00,pBVar6);
  memset(&__range2,0,0x18);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  pBVar8 = Loop::GetBlocks(this->loop_);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(pBVar8);
  _Stack_190._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(pBVar8);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xfffffffffffffe70), bVar2) {
    pvVar10 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    uVar3 = *pvVar10;
    pCVar11 = IRContext::cfg(this->context_);
    CFG::block(pCVar11,uVar3);
    BasicBlock::begin((BasicBlock *)&__end3);
    BasicBlock::end((BasicBlock *)&inst);
    while (bVar2 = utils::operator!=(&__end3.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&inst), bVar2)
    {
      local_1c8 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      local_1c0 = local_1c8;
      sVar13 = std::
               set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               ::count(&this->cloned_loop_instructions_,&local_1c8);
      bVar2 = false;
      if (sVar13 == 1) {
        local_1d0 = local_1c0;
        sVar13 = std::
                 set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::count(&this->original_loop_instructions_,&local_1d0);
        bVar2 = sVar13 == 0;
      }
      if (bVar2) {
        local_1d8 = local_1c0;
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__range2,&local_1d8);
        OVar4 = Instruction::opcode(local_1c0);
        if (OVar4 == OpPhi) {
          this_01 = this->context_;
          uVar3 = Instruction::result_id(local_1c0);
          __range2_1._4_4_ = Instruction::result_id(local_1c0);
          pmVar9 = std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                 *)&clone_results.ptr_map_._M_h._M_single_bucket,
                                (key_type *)((long)&__range2_1 + 4));
          IRContext::ReplaceAllUsesWith(this_01,uVar3,*pmVar9);
        }
      }
      InstructionList::iterator::operator++(&__end3);
    }
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  pBVar8 = Loop::GetBlocks((Loop *)it.iterator_._M_current);
  __end2_1 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::begin(pBVar8);
  _Stack_1f8._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(pBVar8);
  while (bVar2 = std::__detail::operator!=
                           (&__end2_1.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xfffffffffffffe08), bVar2) {
    pvVar10 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2_1);
    uVar3 = *pvVar10;
    pCVar11 = IRContext::cfg(this->context_);
    CFG::block(pCVar11,uVar3);
    BasicBlock::begin((BasicBlock *)&__end3_1);
    BasicBlock::end((BasicBlock *)&inst_1);
    while (bVar2 = utils::operator!=(&__end3_1.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&inst_1),
          bVar2) {
      local_238 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end3_1.super_iterator)
      ;
      old_inst = local_238;
      ppIVar12 = std::
                 unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                 ::operator[]((unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                               *)&cloned_loop,&local_238);
      local_230 = *ppIVar12;
      sVar13 = std::
               set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               ::count(&this->cloned_loop_instructions_,&local_230);
      if ((sVar13 == 0) &&
         (sVar13 = std::
                   set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::count(&this->original_loop_instructions_,&local_230), sVar13 == 1)) {
        __range2_2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)old_inst;
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__range2,(value_type *)&__range2_2);
      }
      InstructionList::iterator::operator++(&__end3_1);
    }
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2);
  i = (Instruction *)
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range2);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                             *)&i), UVar1 = it.iterator_, bVar2) {
    ppIVar14 = __gnu_cxx::
               __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
               ::operator*(&__end2_2);
    IRContext::KillInst(this->context_,*ppIVar14);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2_2);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  LoopUtils::LoopCloningResult::~LoopCloningResult((LoopCloningResult *)&cloned_loop);
  return (Loop *)UVar1._M_current;
}

Assistant:

Loop* LoopFissionImpl::SplitLoop() {
  // Clone the loop.
  LoopUtils util{context_, loop_};
  LoopUtils::LoopCloningResult clone_results;
  Loop* cloned_loop = util.CloneAndAttachLoopToHeader(&clone_results);

  // Update the OpLoopMerge in the cloned loop.
  cloned_loop->UpdateLoopMergeInst();

  // Add the loop_ to the module.
  // TODO(1841): Handle failure to create pre-header.
  Function::iterator it =
      util.GetFunction()->FindBlock(loop_->GetOrCreatePreHeaderBlock()->id());
  util.GetFunction()->AddBasicBlocks(clone_results.cloned_bb_.begin(),
                                     clone_results.cloned_bb_.end(), ++it);
  loop_->SetPreHeaderBlock(cloned_loop->GetMergeBlock());

  std::vector<Instruction*> instructions_to_kill{};

  // Kill all the instructions which should appear in the cloned loop but not in
  // the original loop.
  for (uint32_t id : loop_->GetBlocks()) {
    BasicBlock* block = context_->cfg()->block(id);

    for (Instruction& inst : *block) {
      // If the instruction appears in the cloned loop instruction group, kill
      // it.
      if (cloned_loop_instructions_.count(&inst) == 1 &&
          original_loop_instructions_.count(&inst) == 0) {
        instructions_to_kill.push_back(&inst);
        if (inst.opcode() == spv::Op::OpPhi) {
          context_->ReplaceAllUsesWith(
              inst.result_id(), clone_results.value_map_[inst.result_id()]);
        }
      }
    }
  }

  // Kill all instructions which should appear in the original loop and not in
  // the cloned loop.
  for (uint32_t id : cloned_loop->GetBlocks()) {
    BasicBlock* block = context_->cfg()->block(id);
    for (Instruction& inst : *block) {
      Instruction* old_inst = clone_results.ptr_map_[&inst];
      // If the instruction belongs to the original loop instruction group, kill
      // it.
      if (cloned_loop_instructions_.count(old_inst) == 0 &&
          original_loop_instructions_.count(old_inst) == 1) {
        instructions_to_kill.push_back(&inst);
      }
    }
  }

  for (Instruction* i : instructions_to_kill) {
    context_->KillInst(i);
  }

  return cloned_loop;
}